

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O2

void __thiscall Sinc_ZeroHandling_Test::TestBody(Sinc_ZeroHandling_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char *pcVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Float cur;
  Float prev;
  float local_6c;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar6 = 10000;
  fVar8 = 0.0;
  prev = 1.0;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar1 = fVar8 * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_48 = fVar8;
    if ((auVar3._0_4_ != 1.0) || (fVar8 = 1.0, NAN(auVar3._0_4_))) {
      local_6c = fVar1;
      fVar8 = sinf(fVar1);
      fVar8 = fVar8 / local_6c;
    }
    cur = fVar8;
    testing::internal::CmpHelperLE<float,float>((internal *)&gtest_ar,"cur","prev",&cur,&prev);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x16,pcVar5);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    fVar8 = INFINITY;
    auVar4._4_4_ = uStack_44;
    auVar4._0_4_ = local_48;
    auVar4._8_4_ = uStack_40;
    auVar4._12_4_ = uStack_3c;
    if (local_48 < INFINITY) {
      auVar9._0_12_ = ZEXT812(0);
      auVar9._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar4,auVar9,0);
      local_48 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)local_48);
      fVar8 = (float)((-(uint)(local_48 < 0.0) | 1) + (int)local_48);
    }
    prev = cur;
  }
  iVar6 = 10000;
  fVar8 = 0.0;
  prev = 1.0;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar1 = fVar8 * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_48 = fVar8;
    if ((auVar3._0_4_ != 1.0) || (fVar8 = 1.0, NAN(auVar3._0_4_))) {
      local_6c = fVar1;
      fVar8 = sinf(fVar1);
      fVar8 = fVar8 / local_6c;
    }
    cur = fVar8;
    testing::internal::CmpHelperLE<float,float>((internal *)&gtest_ar,"cur","prev",&cur,&prev);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x1f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    fVar8 = -INFINITY;
    auVar3._4_4_ = uStack_44;
    auVar3._0_4_ = local_48;
    auVar3._8_4_ = uStack_40;
    auVar3._12_4_ = uStack_3c;
    if (-INFINITY < local_48) {
      auVar10._0_12_ = ZEXT812(0);
      auVar10._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar3,auVar10,0);
      bVar7 = (bool)((byte)uVar2 & 1);
      fVar8 = (float)((uint)bVar7 * -0x80000000 + (uint)!bVar7 * (int)local_48);
      fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    }
    prev = cur;
  }
  return;
}

Assistant:

TEST(Sinc, ZeroHandling) {
    Float x = 0;
    Float prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatUp(x);
        prev = cur;
    }

    x = -0;
    prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatDown(x);
        prev = cur;
    }
}